

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O1

void ggml_compute_forward_arange(ggml_compute_params *params,ggml_tensor *dst)

{
  float fVar1;
  int iVar2;
  int iVar3;
  undefined8 uVar4;
  long lVar5;
  char *pcVar6;
  long lVar7;
  undefined8 uVar8;
  int64_t i;
  long lVar9;
  long lVar10;
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [16];
  float fVar24;
  undefined1 auVar25 [16];
  
  if (dst->type != GGML_TYPE_F32) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
               ,0x1a55,"fatal error");
  }
  if (dst->nb[0] == 4) {
    iVar2 = params->ith;
    iVar3 = params->nth;
    auVar25._8_8_ = 0;
    auVar25._0_8_ = *(ulong *)dst->op_params;
    auVar23 = vmovshdup_avx(auVar25);
    fVar1 = (float)dst->op_params[2];
    fVar24 = (float)*(ulong *)dst->op_params;
    auVar23._0_4_ = (auVar23._0_4_ - fVar24) / fVar1;
    auVar23._4_12_ = SUB6012((undefined1  [60])0x0,0);
    auVar23 = vroundss_avx(auVar23,auVar23,10);
    lVar9 = (long)auVar23._0_4_;
    lVar5 = ggml_nelements(dst);
    if (lVar5 == lVar9) {
      if (iVar2 < lVar9) {
        lVar5 = (long)iVar2 + (long)iVar3;
        lVar10 = lVar9;
        if (lVar9 <= lVar5) {
          lVar10 = lVar5;
        }
        lVar7 = 0;
        auVar13 = vpbroadcastq_avx512f();
        auVar14 = vpbroadcastq_avx512f();
        auVar15 = vpmuldq_avx512f(auVar14,_DAT_001556c0);
        auVar14 = vpmuldq_avx512f(auVar14,_DAT_00155700);
        auVar14 = vpaddq_avx512f(auVar13,auVar14);
        auVar13 = vpaddq_avx512f(auVar13,auVar15);
        auVar15 = vpbroadcastq_avx512f();
        auVar16 = vpbroadcastq_avx512f();
        auVar17 = vbroadcastss_avx512f(ZEXT416((uint)fVar1));
        auVar18 = vbroadcastss_avx512f(ZEXT416((uint)fVar24));
        auVar19 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        auVar20 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
        do {
          auVar21 = vpbroadcastq_avx512f();
          auVar22 = vporq_avx512f(auVar21,auVar19);
          auVar21 = vporq_avx512f(auVar21,auVar20);
          uVar8 = vpcmpuq_avx512f(auVar21,auVar16,2);
          auVar11 = vcvtqq2ps_avx512dq(auVar13);
          uVar4 = vpcmpuq_avx512f(auVar22,auVar16,2);
          auVar12 = vcvtqq2ps_avx512dq(auVar14);
          auVar21 = vinsertf64x4_avx512f(ZEXT3264(auVar11),auVar12,1);
          auVar21 = vfmadd213ps_avx512f(auVar21,auVar17,auVar18);
          vscatterqps_avx512f(ZEXT864(dst->data) + auVar13 * (undefined1  [64])0x4,uVar4,
                              auVar21._0_32_);
          auVar11 = vextractf64x4_avx512f(auVar21,1);
          vscatterqps_avx512f(ZEXT864(dst->data) + auVar14 * (undefined1  [64])0x4,uVar8,auVar11);
          lVar7 = lVar7 + 0x10;
          auVar13 = vpaddq_avx512f(auVar13,auVar15);
          auVar14 = vpaddq_avx512f(auVar14,auVar15);
        } while (((lVar10 - (lVar5 + (ulong)(lVar5 < lVar9))) / (ulong)(long)iVar3 +
                  (ulong)(lVar5 < lVar9) & 0xfffffffffffffff0) + 0x10 != lVar7);
      }
      return;
    }
    pcVar6 = "ggml_nelements(dst) == steps";
    uVar8 = 0x1a43;
  }
  else {
    pcVar6 = "dst->nb[0] == sizeof(float)";
    uVar8 = 0x1a38;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
             ,uVar8,"GGML_ASSERT(%s) failed",pcVar6);
}

Assistant:

void ggml_compute_forward_arange(
    const ggml_compute_params * params,
    ggml_tensor * dst) {
    switch (dst->type) {
        case GGML_TYPE_F32:
            {
                ggml_compute_forward_arange_f32(params, dst);
            } break;
        default:
            {
                GGML_ABORT("fatal error");
            }
    }
}